

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O2

int sndio_stream_set_volume(cubeb_stream_conflict2 *s,float volume)

{
  float fVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&s->mtx);
  fVar1 = 0.0;
  if ((0.0 <= volume) && (fVar1 = volume, 1.0 < volume)) {
    fVar1 = 1.0;
  }
  s->volume = fVar1;
  pthread_mutex_unlock((pthread_mutex_t *)&s->mtx);
  return 0;
}

Assistant:

static int
sndio_stream_set_volume(cubeb_stream * s, float volume)
{
  DPR("sndio_stream_set_volume(%f)\n", volume);
  pthread_mutex_lock(&s->mtx);
  if (volume < 0.)
    volume = 0.;
  else if (volume > 1.0)
    volume = 1.;
  s->volume = volume;
  pthread_mutex_unlock(&s->mtx);
  return CUBEB_OK;
}